

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O0

_Bool chck_hash_table_str_set(chck_hash_table *table,char *str,size_t len,void *data)

{
  _Bool _Var1;
  uint32_t uVar2;
  void *data_local;
  size_t len_local;
  char *str_local;
  chck_hash_table *table_local;
  
  if ((table != (chck_hash_table *)0x0) && (str != (char *)0x0)) {
    uVar2 = (*(table->lut).hashstr)(str,len);
    _Var1 = hash_table_set_str(table,(uint32_t)((ulong)uVar2 % (table->lut).count),str,data);
    return _Var1;
  }
  __assert_fail("table && str",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                0x188,
                "_Bool chck_hash_table_str_set(struct chck_hash_table *, const char *, size_t, const void *)"
               );
}

Assistant:

bool
chck_hash_table_str_set(struct chck_hash_table *table, const char *str, size_t len, const void *data)
{
   assert(table && str);
   return hash_table_set_str(table, table->lut.hashstr(str, len) % table->lut.count, str, data);
}